

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O0

void emit_vars(char *type,char *prefix,PseudoGenerator *gen,TextBuffer *mb)

{
  uint uVar1;
  uint local_30;
  uint i;
  uint max_reg;
  TextBuffer *mb_local;
  PseudoGenerator *gen_local;
  char *prefix_local;
  char *type_local;
  
  uVar1 = raviX_max_reg(gen);
  if (uVar1 != 0) {
    for (local_30 = 0; local_30 < uVar1; local_30 = local_30 + 1) {
      if (local_30 == 0) {
        raviX_buffer_add_fstring(mb,"%s ",type);
      }
      else {
        raviX_buffer_add_string(mb," = 0, ");
      }
      raviX_buffer_add_fstring(mb,"%s%d",prefix,(ulong)local_30);
    }
    raviX_buffer_add_string(mb," = 0;\n");
  }
  return;
}

Assistant:

static void emit_vars(const char *type, const char *prefix, PseudoGenerator *gen, TextBuffer *mb)
{
	unsigned max_reg = raviX_max_reg(gen);
	if (max_reg == 0)
		return;
	for (unsigned i = 0; i < max_reg; i++) {
		if (i == 0) {
			raviX_buffer_add_fstring(mb, "%s ", type);
		}
		else {
			raviX_buffer_add_string(mb, " = 0, ");
		}
		raviX_buffer_add_fstring(mb, "%s%d", prefix, i);
	}
	raviX_buffer_add_string(mb, " = 0;\n");
}